

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O3

wchar_t cmd_get_item(command_conflict *cmd,char *arg,object **obj,char *prompt,char *reject,
                    item_tester filter,wchar_t mode)

{
  _Bool _Var1;
  wchar_t wVar2;
  
  wVar2 = cmd_get_arg_item(cmd,arg,obj);
  if (wVar2 == L'\0') {
    if (filter == (item_tester)0x0) {
      return L'\0';
    }
    _Var1 = (*filter)(*obj);
    if (_Var1) {
      return L'\0';
    }
  }
  _Var1 = player_is_shapechanged(player);
  wVar2 = mode & 0xfffffff4;
  if (!_Var1) {
    wVar2 = mode;
  }
  _Var1 = get_item(obj,prompt,reject,cmd->code,filter,wVar2);
  wVar2 = L'\xfffffffd';
  if (_Var1) {
    cmd_set_arg(cmd,arg,arg_ITEM,*obj);
    wVar2 = L'\0';
  }
  return wVar2;
}

Assistant:

int cmd_get_item(struct command *cmd, const char *arg, struct object **obj,
				 const char *prompt, const char *reject, item_tester filter,
				 int mode)
{
	if ((cmd_get_arg_item(cmd, arg, obj) == CMD_OK) && (!filter|| filter(*obj)))
		return CMD_OK;

	/* Shapechanged players can only access the floor */
	if (player_is_shapechanged(player)) {
		mode &= ~(USE_EQUIP | USE_INVEN | USE_QUIVER);
	}

	if (get_item(obj, prompt, reject, cmd->code, filter, mode)) {
		cmd_set_arg_item(cmd, arg, *obj);
		return CMD_OK;
	}

	return CMD_ARG_ABORTED;
}